

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LinkedModel::SerializeWithCachedSizes
          (LinkedModel *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  LinkedModel *this_local;
  
  bVar1 = has_linkedmodelfile(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->LinkType_).linkedmodelfile_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void LinkedModel::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LinkedModel)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.LinkedModelFile linkedModelFile = 1;
  if (has_linkedmodelfile()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *LinkType_.linkedmodelfile_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LinkedModel)
}